

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void sysbvm_analysisQueue_enqueueProgramEntity
               (sysbvm_context_t *context,sysbvm_tuple_t queue,sysbvm_tuple_t programEntity)

{
  sysbvm_object_tuple_t *psVar1;
  undefined8 *puVar2;
  
  if (queue == 0 || (queue & 0xf) != 0) {
    sysbvm_error("Expected a valid analysis queue.");
  }
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).analysisQueueEntryType,2);
  (psVar1->field_1).pointers[0] = programEntity;
  puVar2 = (undefined8 *)(*(long *)(queue + 0x18) + 0x18);
  if (*(long *)(queue + 0x18) == 0) {
    puVar2 = (undefined8 *)(queue + 0x10);
  }
  *puVar2 = psVar1;
  *(sysbvm_object_tuple_t **)(queue + 0x18) = psVar1;
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisQueue_enqueueProgramEntity(sysbvm_context_t *context, sysbvm_tuple_t queue, sysbvm_tuple_t programEntity)
{
    if(!sysbvm_tuple_isNonNullPointer(queue))
        sysbvm_error("Expected a valid analysis queue.");

    sysbvm_analysisQueue_t *queueObject = (sysbvm_analysisQueue_t*)queue;
    sysbvm_tuple_t newEntry = sysbvm_analysisQueueEntry_create(context, programEntity);
    if(queueObject->lastEntry)
        ((sysbvm_analysisQueueEntry_t*)queueObject->lastEntry)->nextEntry = newEntry;
    else
        queueObject->firstEntry = newEntry;
    queueObject->lastEntry = newEntry;
}